

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint readBitsFromStream(size_t *bitpointer,uchar *bitstream,size_t nbits)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = 0;
  for (uVar3 = 0; uVar3 != nbits; uVar3 = uVar3 + 1) {
    uVar1 = *bitpointer;
    uVar2 = uVar2 + ((uint)((bitstream[uVar1 >> 3] >> ((uint)uVar1 & 7) & 1) != 0) <<
                    ((byte)uVar3 & 0x1f));
    *bitpointer = uVar1 + 1;
  }
  return uVar2;
}

Assistant:

static unsigned readBitsFromStream(size_t* bitpointer, const unsigned char* bitstream, size_t nbits)
{
	unsigned result = 0, i;
	for (i = 0; i != nbits; ++i)
	{
		result += ((unsigned)READBIT(*bitpointer, bitstream)) << i;
		++(*bitpointer);
	}
	return result;
}